

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthreads_summator_lib.cpp
# Opt level: O2

void * thread(void *thread_data)

{
  char cVar1;
  ostream *poVar2;
  undefined8 uVar3;
  int num;
  undefined8 local_3c0;
  undefined1 local_3b8 [16];
  ifstream in;
  byte abStack_388 [488];
  stringstream ss;
  ostream local_190 [8];
  string local_188 [368];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_190,"..\\Files\\");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*thread_data);
  std::operator<<(poVar2,".txt");
  std::__cxx11::stringbuf::str();
  std::ifstream::ifstream(&in,(string *)&num,_S_in);
  std::__cxx11::string::~string((string *)&num);
  _num = local_3b8;
  local_3c0 = 0;
  local_3b8[0] = 0;
  std::__cxx11::stringbuf::str(local_188);
  std::__cxx11::string::~string((string *)&num);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    while ((abStack_388[*(long *)(_in + -0x18)] & 2) == 0) {
      std::istream::operator>>((istream *)&in,&num);
      *(long *)((long)thread_data + 8) = *(long *)((long)thread_data + 8) + (long)num;
    }
  }
  uVar3 = std::ifstream::close();
  std::ifstream::~ifstream(&in);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  _Unwind_Resume(uVar3);
}

Assistant:

void* thread(void *thread_data) {
    stringstream ss;
    thr_data *data = (thr_data*) thread_data;

    ss << "..\\Files\\" << data->numberFile << ".txt";
    ifstream in(ss.str());
    ss.str(string());
    if (in.is_open()) {
        while (!in.eof()) {
            int num;
            in >> num;
            data->sum += num;
        }
    }
    in.close();
}